

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O0

bool __thiscall
google::protobuf::io::ArrayInputStream::Next(ArrayInputStream *this,void **data,int *size)

{
  bool bVar1;
  int *piVar2;
  undefined4 *in_RDX;
  long *in_RSI;
  long in_RDI;
  int local_24;
  undefined4 *local_20;
  long *local_18;
  bool local_1;
  
  bVar1 = *(int *)(in_RDI + 0x10) <= *(int *)(in_RDI + 0x18);
  if (bVar1) {
    *(undefined4 *)(in_RDI + 0x1c) = 0;
  }
  else {
    local_24 = *(int *)(in_RDI + 0x10) - *(int *)(in_RDI + 0x18);
    local_20 = in_RDX;
    local_18 = in_RSI;
    piVar2 = std::min<int>((int *)(in_RDI + 0x14),&local_24);
    *(int *)(in_RDI + 0x1c) = *piVar2;
    *local_18 = *(long *)(in_RDI + 8) + (long)*(int *)(in_RDI + 0x18);
    *local_20 = *(undefined4 *)(in_RDI + 0x1c);
    *(int *)(in_RDI + 0x18) = *(int *)(in_RDI + 0x1c) + *(int *)(in_RDI + 0x18);
  }
  local_1 = !bVar1;
  return local_1;
}

Assistant:

bool ArrayInputStream::Next(const void** data, int* size) {
  if (position_ < size_) {
    last_returned_size_ = std::min(block_size_, size_ - position_);
    *data = data_ + position_;
    *size = last_returned_size_;
    position_ += last_returned_size_;
    return true;
  } else {
    // We're at the end of the array.
    last_returned_size_ = 0;  // Don't let caller back up.
    return false;
  }
}